

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::cast_from_variable_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  BaseType expr_type_00;
  string local_48;
  
  if ((expr_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    return;
  }
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (pSVar4 != (SPIRVariable *)0x0) {
    source_id = (pSVar4->super_IVariant).self.id;
  }
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  if (!bVar2) {
    return;
  }
  uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  expr_type_00 = Int;
  if ((int)uVar3 < 0x1148) {
    if (0x2b < uVar3) {
      return;
    }
    if ((0xc00001406e0U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00216aaf;
    if ((0x3f000000UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      return;
    }
LAB_00216a8d:
    expr_type_00 = UInt;
  }
  else {
    uVar1 = uVar3 - 0x14ae;
    if (uVar1 < 0x3a) {
      if ((0x200000006000007U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_00216a8d;
      if ((ulong)uVar1 == 0x21) goto LAB_00216aaf;
    }
    if (((0x14 < uVar3 - 0x1148) || ((0x100107U >> (uVar3 - 0x1148 & 0x1f) & 1) == 0)) &&
       (uVar3 != 0x1396)) {
      return;
    }
  }
LAB_00216aaf:
  if (expr_type_00 != *(BaseType *)&(expr_type->super_IVariant).field_0xc) {
    bitcast_expression(&local_48,this,expr_type,expr_type_00,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool empty() const SPIRV_CROSS_NOEXCEPT
	{
		return buffer_size == 0;
	}